

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O2

vm_obj_id_t CVmObjBigNum::create_from_stack(uchar **pc_ptr,uint argc)

{
  vm_val_t *pvVar1;
  int iVar2;
  undefined4 obj_id;
  ushort *puVar3;
  CVmObjPageEntry *pCVar4;
  CVmObjBigNum *pCVar5;
  size_t digits;
  vm_val_t new_val;
  
  pvVar1 = sp_;
  if (argc - 3 < 0xfffffffe) {
    err_throw(0x899);
  }
  if (sp_[-1].typ == VM_INT) {
    puVar3 = (ushort *)0x0;
LAB_0022b8e8:
    pCVar4 = (CVmObjPageEntry *)0x0;
  }
  else {
    if ((sp_[-1].typ != VM_OBJ) || (iVar2 = is_bignum_obj(sp_[-1].val.obj), iVar2 == 0)) {
      puVar3 = (ushort *)vm_val_t::get_as_string(pvVar1 + -1);
      if (puVar3 == (ushort *)0x0) {
        err_throw(0x7d4);
      }
      goto LAB_0022b8e8;
    }
    pCVar4 = G_obj_table_X.pages_[pvVar1[-1].val.obj >> 0xc] + (pvVar1[-1].val.obj & 0xfff);
    puVar3 = (ushort *)0x0;
  }
  if (argc < 2) {
    if (puVar3 != (ushort *)0x0) {
      iVar2 = precision_from_string((char *)(puVar3 + 1),(ulong)*puVar3,10);
      digits = (size_t)iVar2;
      goto LAB_0022b929;
    }
    if (pCVar4 == (CVmObjPageEntry *)0x0) {
      digits = 0x20;
      goto LAB_0022b982;
    }
    puVar3 = *(ushort **)((long)&pCVar4->ptr_ + 8);
    digits = (size_t)*puVar3;
  }
  else {
    if (sp_[-2].typ != VM_INT) {
      err_throw(0x7d5);
    }
    digits = (size_t)sp_[-2].val.intval;
    if (puVar3 != (ushort *)0x0) {
LAB_0022b929:
      obj_id = vm_new_id(0,0,0);
      pCVar5 = (CVmObjBigNum *)CVmObject::operator_new(0x10,obj_id);
      CVmObjBigNum(pCVar5,(char *)(puVar3 + 1),(ulong)*puVar3,digits);
      goto LAB_0022b9a8;
    }
    if (pCVar4 == (CVmObjPageEntry *)0x0) {
LAB_0022b982:
      obj_id = vm_new_id(0,0,0);
      pCVar5 = (CVmObjBigNum *)CVmObject::operator_new(0x10,obj_id);
      CVmObjBigNum(pCVar5,(long)pvVar1[-1].val.intval,digits);
      goto LAB_0022b9a8;
    }
    puVar3 = *(ushort **)((long)&pCVar4->ptr_ + 8);
  }
  round_val(&new_val,(char *)puVar3,digits,1);
  obj_id = new_val.val.obj;
LAB_0022b9a8:
  sp_ = sp_ + -(ulong)argc;
  return obj_id;
}

Assistant:

vm_obj_id_t CVmObjBigNum::create_from_stack(VMG_ const uchar **pc_ptr,
                                            uint argc)
{
    vm_obj_id_t id;
    vm_val_t *val;
    size_t digits;
    const char *strval = 0;
    const CVmObjBigNum *objval = 0;

    /* check arguments */
    if (argc < 1 || argc > 2)
        err_throw(VMERR_WRONG_NUM_OF_ARGS);

    /* 
     *   check the first argument, which gives the source value - this can be
     *   an integer, a string, or another BigNumber value 
     */
    val = G_stk->get(0);
    if (val->typ == VM_INT)
    {
        /* we'll use the integer value */
    }
    else if (val->typ == VM_OBJ && is_bignum_obj(vmg_ val->val.obj))
    {
        /* we'll use the BigNumber value as the source */
        objval = (CVmObjBigNum *)vm_objp(vmg_ val->val.obj);
    }
    else if ((strval = val->get_as_string(vmg0_)) != 0)
    {
        /* we'll parse the string value */
    }
    else
    {
        /* it's not a source type we accept */
        err_throw(VMERR_NUM_VAL_REQD);
    }

    /* 
     *   get the precision value, if provided; if not, infer it from the
     *   source value 
     */
    if (argc > 1)
    {
        /* make sure it's an integer */
        if (G_stk->get(1)->typ != VM_INT)
            err_throw(VMERR_INT_VAL_REQD);

        /* retrieve the value */
        digits = (size_t)G_stk->get(1)->val.intval;
    }
    else if (strval != 0)
    {
        /* parse the string to infer the precision */
        digits = precision_from_string(
            strval + VMB_LEN, vmb_get_len(strval), 10);
    }
    else if (objval != 0)
    {
        /* use the same precision as the source BigNumber value */
        digits = get_prec(objval->get_ext());
    }
    else
    {
        /* use a default precision */
        digits = 32;
    }

    /* create the value */
    if (strval != 0)
    {
        /* create the value from the string */
        id = vm_new_id(vmg_ FALSE, FALSE, FALSE);
        new (vmg_ id) CVmObjBigNum(vmg_ strval + VMB_LEN,
                                   vmb_get_len(strval), digits);
    }
    else if (objval != 0)
    {
        vm_val_t new_val;

        /* create the value based on the BigNumber value */
        round_val(vmg_ &new_val, objval->get_ext(), digits, TRUE);

        /* return the new object ID */
        id = new_val.val.obj;
    }
    else
    {
        /* create the value based on the integer value */
        id = vm_new_id(vmg_ FALSE, FALSE, FALSE);
        new (vmg_ id) CVmObjBigNum(vmg_ (long)val->val.intval, digits);
    }

    /* discard arguments */
    G_stk->discard(argc);

    /* return the new object */
    return id;
}